

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::DeleteProperty
          (JavascriptArray *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  bool bVar1;
  ScriptContext *scriptContext;
  PropertyOperationFlags flags_local;
  JavascriptString *propertyNameString_local;
  JavascriptArray *this_local;
  
  bVar1 = BuiltInPropertyRecord<7>::Equals
                    ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::length,propertyNameString);
  if (bVar1) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              (flags,scriptContext,(PCWSTR)(BuiltInPropertyRecords::length + 0x18));
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = DynamicObject::DeleteProperty((DynamicObject *)this,propertyNameString,flags)
    ;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        if (BuiltInPropertyRecords::length.Equals(propertyNameString))
        {
            JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                flags, GetScriptContext(), BuiltInPropertyRecords::length.buffer);

            return false;
        }
        return DynamicObject::DeleteProperty(propertyNameString, flags);
    }